

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O2

maybe<std::pair<const_int,_unsigned_long>_> * __thiscall
rangeless::fn::impl::to_seq::
gen<std::map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>_>
::operator()(maybe<std::pair<const_int,_unsigned_long>_> *__return_storage_ptr__,
            gen<std::map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>_>
            *this)

{
  _Base_ptr p_Var1;
  pair<const_int,_unsigned_long> val;
  
  if (this->started == false) {
    this->started = true;
    p_Var1 = (this->inps)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    (this->it)._M_node = p_Var1;
  }
  else {
    p_Var1 = (this->it)._M_node;
    if ((_Rb_tree_header *)p_Var1 != &(this->inps)._M_t._M_impl.super__Rb_tree_header) {
      std::_Rb_tree_iterator<std::pair<const_int,_unsigned_long>_>::operator++(&this->it);
      p_Var1 = (this->it)._M_node;
    }
  }
  if ((_Rb_tree_header *)p_Var1 == &(this->inps)._M_t._M_impl.super__Rb_tree_header) {
    __return_storage_ptr__->m_empty = true;
  }
  else {
    val._4_4_ = 0;
    val.first = p_Var1[1]._M_color;
    val.second = (unsigned_long)p_Var1[1]._M_parent;
    maybe<std::pair<const_int,_unsigned_long>_>::maybe(__return_storage_ptr__,val);
  }
  return __return_storage_ptr__;
}

Assistant:

auto operator()() -> maybe<value_type>
            {
                if(!started) {
                    started = true;
                    it = inps.begin(); 
                        // r might not be a container (i.e. some input-range
                        // and begin()  may be non-const, so deferring until
                        // the first call to operator() rather than
                        // initializing it{ r.begin() } in constructor.
                } else if(it == inps.end()) {
                    ; // may be equal to end in case of repeated calls to operator() after ended
                } else {
                    ++it;
                }

                if(it == inps.end()) {
                    return { };
                } else {
                    return { std::move(*it) };
                }
            }